

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

ssize_t __thiscall
ddd::DaTrie<false,_true,_false>::write
          (DaTrie<false,_true,_false> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  ostream *os;
  
  os = (ostream *)CONCAT44(in_register_00000034,__fd);
  utils::write_vector<ddd::Bc>(&this->bc_,os);
  utils::write_vector<char>(&this->tail_,os);
  utils::write_vector<ddd::Block>(&this->blocks_,os);
  utils::write_vector<ddd::NodeLink>(&this->node_links_,os);
  utils::write_value<unsigned_int>(this->head_pos_,os);
  utils::write_value<unsigned_int>(this->bc_emps_,os);
  utils::write_value<unsigned_int>(this->tail_emps_,os);
  return extraout_RAX;
}

Assistant:

void write(std::ostream& os) const {
    utils::write_vector(bc_, os);
    utils::write_vector(tail_, os);
    utils::write_vector(blocks_, os);
    utils::write_vector(node_links_, os);
    utils::write_value(head_pos_, os);
    utils::write_value(bc_emps_, os);
    utils::write_value(tail_emps_, os);
  }